

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plt-elf.c
# Opt level: O1

size_t get_offsets(plt_ctx ctx,plt_lib lib,char *name,plt_offset **offsets)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long *plVar4;
  int iVar5;
  Elf64_Dyn *dyn;
  long *plVar6;
  long lVar7;
  void *pvVar8;
  ulong uVar9;
  size_t sVar10;
  Elf64_Addr base;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  rel_info info [2];
  ulong local_68 [4];
  long local_48;
  long local_40;
  
  uVar1 = *(ulong *)ctx;
  plVar6 = (long *)ctx->r_brk;
  lVar7 = *plVar6;
  if (lVar7 == 0) {
    uVar13 = 0;
  }
  else {
    uVar13 = 0;
    lVar14 = lVar7;
    plVar4 = plVar6;
    do {
      if (lVar14 == 6) {
        uVar13 = plVar4[1];
        if (0xfeffffffffffffff < uVar13 || uVar13 < uVar1) {
          uVar13 = uVar13 + uVar1;
        }
        break;
      }
      lVar14 = plVar4[2];
      plVar4 = plVar4 + 2;
    } while (lVar14 != 0);
  }
  if (lVar7 == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    lVar14 = lVar7;
    plVar4 = plVar6;
    do {
      if (lVar14 == 5) {
        uVar9 = plVar4[1];
        if (0xfeffffffffffffff < uVar9 || uVar9 < uVar1) {
          uVar9 = uVar9 + uVar1;
        }
        break;
      }
      lVar14 = plVar4[2];
      plVar4 = plVar4 + 2;
    } while (lVar14 != 0);
  }
  if (lVar7 == 0) {
    local_68[3] = 0;
  }
  else {
    local_68[3] = 0;
    lVar14 = lVar7;
    plVar4 = plVar6;
    do {
      if (lVar14 == 0x17) {
        local_68[3] = plVar4[1];
        if (0xfeffffffffffffff < local_68[3] || local_68[3] < uVar1) {
          local_68[3] = local_68[3] + uVar1;
        }
        break;
      }
      lVar14 = plVar4[2];
      plVar4 = plVar4 + 2;
    } while (lVar14 != 0);
  }
  if (lVar7 == 0) {
    local_48 = 0;
  }
  else {
    local_48 = 0;
    lVar14 = lVar7;
    plVar4 = plVar6;
    do {
      if (lVar14 == 2) {
        local_48 = plVar4[1];
        break;
      }
      lVar14 = plVar4[2];
      plVar4 = plVar4 + 2;
    } while (lVar14 != 0);
  }
  if (lVar7 == 0) {
    local_68[0] = 0;
  }
  else {
    local_68[0] = 0;
    lVar14 = lVar7;
    plVar4 = plVar6;
    do {
      if (lVar14 == 7) {
        local_68[0] = plVar4[1];
        if (0xfeffffffffffffff < local_68[0] || local_68[0] < uVar1) {
          local_68[0] = local_68[0] + uVar1;
        }
        break;
      }
      lVar14 = plVar4[2];
      plVar4 = plVar4 + 2;
    } while (lVar14 != 0);
  }
  if (local_68[0] == 0) {
    if (lVar7 == 0) {
      local_68[0] = 0;
    }
    else {
      local_68[0] = 0;
      lVar14 = lVar7;
      plVar4 = plVar6;
      do {
        if (lVar14 == 0x11) {
          local_68[0] = plVar4[1];
          if (0xfeffffffffffffff < local_68[0] || local_68[0] < uVar1) {
            local_68[0] = local_68[0] + uVar1;
          }
          break;
        }
        lVar14 = plVar4[2];
        plVar4 = plVar4 + 2;
      } while (lVar14 != 0);
    }
    if (local_68[0] == 0) {
      return 0;
    }
    if (lVar7 == 0) {
      local_68[1] = 0;
    }
    else {
      local_68[1] = 0;
      lVar14 = lVar7;
      plVar4 = plVar6;
      do {
        if (lVar14 == 0x12) {
          local_68[1] = plVar4[1];
          break;
        }
        lVar14 = plVar4[2];
        plVar4 = plVar4 + 2;
      } while (lVar14 != 0);
    }
    if (lVar7 != 0) {
      local_68[2] = 0;
      do {
        if (lVar7 == 0x13) goto LAB_00102f89;
        lVar7 = plVar6[2];
        plVar6 = plVar6 + 2;
      } while (lVar7 != 0);
      goto LAB_00102f8d;
    }
  }
  else {
    if (lVar7 == 0) {
      local_68[1] = 0;
    }
    else {
      local_68[1] = 0;
      lVar14 = lVar7;
      plVar4 = plVar6;
      do {
        if (lVar14 == 8) {
          local_68[1] = plVar4[1];
          break;
        }
        lVar14 = plVar4[2];
        plVar4 = plVar4 + 2;
      } while (lVar14 != 0);
    }
    if (lVar7 != 0) {
      local_68[2] = 0;
      do {
        if (lVar7 == 9) goto LAB_00102f89;
        lVar7 = plVar6[2];
        plVar6 = plVar6 + 2;
      } while (lVar7 != 0);
      goto LAB_00102f8d;
    }
  }
  local_68[2] = 0;
LAB_00102f8d:
  sVar10 = 0;
  if ((uVar13 != 0) && (uVar9 != 0)) {
    sVar10 = 0;
    if ((local_68[1] != 0 || local_48 != 0) && (sVar10 = 0, local_68[2] != 0)) {
      if (name != (char *)0x0) {
        name[0] = '\0';
        name[1] = '\0';
        name[2] = '\0';
        name[3] = '\0';
        name[4] = '\0';
        name[5] = '\0';
        name[6] = '\0';
        name[7] = '\0';
      }
      local_40 = local_68[2];
      sVar10 = 0;
      lVar7 = 0;
      do {
        uVar2 = local_68[lVar7 * 3 + 1];
        uVar3 = local_68[lVar7 * 3 + 2];
        lVar14 = 0;
        if (uVar3 <= uVar2) {
          lVar14 = local_68[lVar7 * 3] + 8;
          uVar11 = 0;
          do {
            iVar5 = strcmp((char *)(*(uint *)(uVar13 + (ulong)*(uint *)(lVar14 + 4) * 0x18) + uVar9)
                           ,(char *)lib);
            if (iVar5 == 0) {
              lVar14 = *(long *)(lVar14 + -8);
              goto LAB_00103074;
            }
            uVar11 = uVar11 + 1;
            lVar14 = lVar14 + uVar3;
          } while (uVar11 < uVar2 / uVar3);
          lVar14 = 0;
        }
LAB_00103074:
        if (lVar14 != 0) {
          if (name != (char *)0x0) {
            lVar12 = sVar10 * 0x10;
            pvVar8 = mmk_realloc(*(void **)name,lVar12 + 0x10);
            *(void **)name = pvVar8;
            *(ulong *)((long)pvVar8 + lVar12) = lVar14 + uVar1;
            *(undefined8 *)((long)pvVar8 + lVar12 + 8) = 0;
          }
          sVar10 = sVar10 + 1;
        }
        bVar15 = lVar7 == 0;
        lVar7 = lVar7 + 1;
      } while (bVar15);
    }
  }
  return sVar10;
LAB_00102f89:
  local_68[2] = plVar6[1];
  goto LAB_00102f8d;
}

Assistant:

static size_t get_offsets(plt_ctx ctx, plt_lib lib, const char *name, plt_offset ** offsets)
{
    ElfW(Sym) *symtab   = (ElfW(Sym)*)  lib_dt_lookup(lib, DT_SYMTAB);
    const char *strtab  = (const char*) lib_dt_lookup(lib, DT_STRTAB);

    ElfW(Rel)   *jmprel = lib_dt_lookup(lib, DT_JMPREL);

    ElfWord jmprel_sz = lib_dt_lookup_val(lib, DT_PLTRELSZ);
    ElfWord relent_sz;
    ElfWord rel_sz;

    // For relocation sections try DT_RELA first, then DT_REL. We don't deal with
    // addends anyway.
    ElfW(Rel) *rel = lib_dt_lookup(lib, DT_RELA);
    if (!rel) {
        rel = lib_dt_lookup(lib, DT_REL);
        if (!rel)
            return 0;
        rel_sz = lib_dt_lookup_val(lib, DT_RELSZ);
        relent_sz = lib_dt_lookup_val(lib, DT_RELENT);
    } else {
        rel_sz = lib_dt_lookup_val(lib, DT_RELASZ);
        relent_sz = lib_dt_lookup_val(lib, DT_RELAENT);
    }

    if (!symtab || !strtab || !(rel || jmprel) || !(rel_sz || jmprel_sz) || !relent_sz)
        return 0;

    ElfW(Addr) base = (ElfW(Addr)) lib->l_addr;
#ifdef __FreeBSD__
    if (lib == ctx->r_map)
        base = 0;
#endif

    size_t n = 0;
    if (offsets) {
        *offsets = NULL;
    }

    struct rel_info info[] = {
        {
          .tab = rel,
          .size = rel_sz,
          .entry_sz = relent_sz,
        },
        {
          .tab = jmprel,
          .size = jmprel_sz,
          .entry_sz = relent_sz,
        }
    };

    for (size_t i = 0; i < sizeof(info) / sizeof(struct rel_info); ++i) {
        uintptr_t off = get_offset(&info[i], symtab, strtab, name);
        if (off) {
            if (offsets) {
                *offsets = mmk_realloc(*offsets, (n + 1) * sizeof(plt_offset));
                (*offsets)[n] = (plt_offset) { .offset = (plt_fn **)(base + off) };
            }
            ++n;
        }
    }

    return n;
}